

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall
mkvparser::ContentEncoding::ParseContentEncodingEntry
          (ContentEncoding *this,longlong start,longlong size,IMkvReader *pReader)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  ContentCompression **ppCVar4;
  ContentEncryption **ppCVar5;
  long lVar6;
  unsigned_long_long uVar7;
  ContentCompression *this_00;
  ContentEncryption *this_01;
  ContentEncryption *local_f0;
  ContentCompression *local_d8;
  ContentEncryption *encryption;
  ContentCompression *compression;
  long status_1;
  longlong size_2;
  longlong id_1;
  long status;
  longlong size_1;
  longlong id;
  longlong encryption_count;
  longlong compression_count;
  longlong stop;
  longlong pos;
  IMkvReader *pReader_local;
  longlong size_local;
  longlong start_local;
  ContentEncoding *this_local;
  
  pos = (longlong)pReader;
  pReader_local = (IMkvReader *)size;
  size_local = start;
  start_local = (longlong)this;
  if (pReader == (IMkvReader *)0x0) {
    __assert_fail("pReader",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x106c,
                  "long mkvparser::ContentEncoding::ParseContentEncodingEntry(long long, long long, IMkvReader *)"
                 );
  }
  compression_count = start + size;
  encryption_count = 0;
  id = 0;
  stop = start;
  while (stop < compression_count) {
    id_1 = ParseElementHeader((IMkvReader *)pos,&stop,compression_count,&size_1,&status);
    if (id_1 < 0) {
      return id_1;
    }
    if ((size_1 == 0x5034) &&
       (encryption_count = encryption_count + 1, 0x7fffffff < encryption_count)) {
      return -1;
    }
    if ((size_1 == 0x5035) && (id = id + 1, 0x7fffffff < id)) {
      return -1;
    }
    stop = status + stop;
    if (compression_count < stop) {
      return -2;
    }
  }
  if ((encryption_count < 1) && (id < 1)) {
    return -1;
  }
  if (0 < encryption_count) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = encryption_count;
    uVar3 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    ppCVar4 = (ContentCompression **)operator_new__(uVar3,(nothrow_t *)&std::nothrow);
    this->compression_entries_ = ppCVar4;
    if (this->compression_entries_ == (ContentCompression **)0x0) {
      return -1;
    }
    this->compression_entries_end_ = this->compression_entries_;
  }
  if (0 < id) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = id;
    uVar3 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    ppCVar5 = (ContentEncryption **)operator_new__(uVar3,(nothrow_t *)&std::nothrow);
    this->encryption_entries_ = ppCVar5;
    if (this->encryption_entries_ == (ContentEncryption **)0x0) {
      if (this->compression_entries_ != (ContentCompression **)0x0) {
        operator_delete__(this->compression_entries_);
      }
      this->compression_entries_ = (ContentCompression **)0x0;
      return -1;
    }
    this->encryption_entries_end_ = this->encryption_entries_;
  }
  stop = size_local;
  do {
    if (compression_count <= stop) {
      if (stop != compression_count) {
        return -2;
      }
      return 0;
    }
    lVar6 = ParseElementHeader((IMkvReader *)pos,&stop,compression_count,&size_2,&status_1);
    if (lVar6 < 0) {
      return lVar6;
    }
    if (size_2 == 0x5031) {
      uVar7 = UnserializeUInt((IMkvReader *)pos,stop,status_1);
      this->encoding_order_ = uVar7;
    }
    else if (size_2 == 0x5032) {
      uVar7 = UnserializeUInt((IMkvReader *)pos,stop,status_1);
      this->encoding_scope_ = uVar7;
      if (this->encoding_scope_ == 0) {
        return -1;
      }
    }
    else if (size_2 == 0x5033) {
      uVar7 = UnserializeUInt((IMkvReader *)pos,stop,status_1);
      this->encoding_type_ = uVar7;
    }
    else if (size_2 == 0x5034) {
      this_00 = (ContentCompression *)operator_new(0x18,(nothrow_t *)&std::nothrow);
      local_d8 = (ContentCompression *)0x0;
      if (this_00 != (ContentCompression *)0x0) {
        ContentCompression::ContentCompression(this_00);
        local_d8 = this_00;
      }
      if (local_d8 == (ContentCompression *)0x0) {
        return -1;
      }
      lVar6 = ParseCompressionEntry(this,stop,status_1,(IMkvReader *)pos,local_d8);
      if (lVar6 != 0) {
        if (local_d8 == (ContentCompression *)0x0) {
          return lVar6;
        }
        ContentCompression::~ContentCompression(local_d8);
        operator_delete(local_d8);
        return lVar6;
      }
      if (encryption_count < 1) {
        __assert_fail("compression_count > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x10bc,
                      "long mkvparser::ContentEncoding::ParseContentEncodingEntry(long long, long long, IMkvReader *)"
                     );
      }
      ppCVar4 = this->compression_entries_end_;
      this->compression_entries_end_ = ppCVar4 + 1;
      *ppCVar4 = local_d8;
    }
    else if (size_2 == 0x5035) {
      this_01 = (ContentEncryption *)operator_new(0x50,(nothrow_t *)&std::nothrow);
      local_f0 = (ContentEncryption *)0x0;
      if (this_01 != (ContentEncryption *)0x0) {
        ContentEncryption::ContentEncryption(this_01);
        local_f0 = this_01;
      }
      if (local_f0 == (ContentEncryption *)0x0) {
        return -1;
      }
      lVar6 = ParseEncryptionEntry(this,stop,status_1,(IMkvReader *)pos,local_f0);
      if (lVar6 != 0) {
        if (local_f0 == (ContentEncryption *)0x0) {
          return lVar6;
        }
        ContentEncryption::~ContentEncryption(local_f0);
        operator_delete(local_f0);
        return lVar6;
      }
      if (id < 1) {
        __assert_fail("encryption_count > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x10c9,
                      "long mkvparser::ContentEncoding::ParseContentEncodingEntry(long long, long long, IMkvReader *)"
                     );
      }
      ppCVar5 = this->encryption_entries_end_;
      this->encryption_entries_end_ = ppCVar5 + 1;
      *ppCVar5 = local_f0;
    }
    stop = status_1 + stop;
    if (compression_count < stop) {
      return -2;
    }
  } while( true );
}

Assistant:

long ContentEncoding::ParseContentEncodingEntry(long long start, long long size,
                                                IMkvReader* pReader) {
  assert(pReader);

  long long pos = start;
  const long long stop = start + size;

  // Count ContentCompression and ContentEncryption elements.
  long long compression_count = 0;
  long long encryption_count = 0;

  while (pos < stop) {
    long long id, size;
    const long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvContentCompression) {
      ++compression_count;
      if (compression_count > INT_MAX)
        return E_PARSE_FAILED;
    }

    if (id == libwebm::kMkvContentEncryption) {
      ++encryption_count;
      if (encryption_count > INT_MAX)
        return E_PARSE_FAILED;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (compression_count <= 0 && encryption_count <= 0)
    return -1;

  if (compression_count > 0) {
    compression_entries_ = new (std::nothrow)
        ContentCompression*[static_cast<size_t>(compression_count)];
    if (!compression_entries_)
      return -1;
    compression_entries_end_ = compression_entries_;
  }

  if (encryption_count > 0) {
    encryption_entries_ = new (std::nothrow)
        ContentEncryption*[static_cast<size_t>(encryption_count)];
    if (!encryption_entries_) {
      delete[] compression_entries_;
      compression_entries_ = NULL;
      return -1;
    }
    encryption_entries_end_ = encryption_entries_;
  }

  pos = start;
  while (pos < stop) {
    long long id, size;
    long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvContentEncodingOrder) {
      encoding_order_ = UnserializeUInt(pReader, pos, size);
    } else if (id == libwebm::kMkvContentEncodingScope) {
      encoding_scope_ = UnserializeUInt(pReader, pos, size);
      if (encoding_scope_ < 1)
        return -1;
    } else if (id == libwebm::kMkvContentEncodingType) {
      encoding_type_ = UnserializeUInt(pReader, pos, size);
    } else if (id == libwebm::kMkvContentCompression) {
      ContentCompression* const compression =
          new (std::nothrow) ContentCompression();
      if (!compression)
        return -1;

      status = ParseCompressionEntry(pos, size, pReader, compression);
      if (status) {
        delete compression;
        return status;
      }
      assert(compression_count > 0);
      *compression_entries_end_++ = compression;
    } else if (id == libwebm::kMkvContentEncryption) {
      ContentEncryption* const encryption =
          new (std::nothrow) ContentEncryption();
      if (!encryption)
        return -1;

      status = ParseEncryptionEntry(pos, size, pReader, encryption);
      if (status) {
        delete encryption;
        return status;
      }
      assert(encryption_count > 0);
      *encryption_entries_end_++ = encryption;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;
  return 0;
}